

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O0

void __thiscall jbcoin::tests::ValidatorKeys_test::testMakeValidatorKeys(ValidatorKeys_test *this)

{
  uint value;
  const_iterator pvVar1;
  string *psVar2;
  Value *pVVar3;
  char *value_00;
  Value local_a78;
  Value local_a68;
  string local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  Value local_9d8;
  string local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  Value local_948;
  string local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  string local_8b8;
  Value local_898;
  Seed local_888;
  undefined1 local_878 [8];
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> kp;
  ValidatorKeys keys_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  Value local_748;
  KeyType local_734;
  undefined1 local_730 [4];
  KeyType keyType_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  Value local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  Value local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  Value local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  Value local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  Value local_570;
  undefined1 local_560 [8];
  Value jv;
  runtime_error *e_1;
  undefined1 local_4e0 [8];
  ofstream o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  bool local_2b9 [9];
  runtime_error *e;
  string local_250 [8];
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expectedError;
  KeyFileGuard g_1;
  undefined1 local_1e0 [8];
  ValidatorKeys keys2;
  undefined1 local_178 [8];
  KeyFileGuard g;
  ValidatorKeys keys;
  value_type keyType;
  const_iterator __end2;
  const_iterator __begin2;
  array<jbcoin::KeyType,_2UL> *__range2;
  path local_b0;
  undefined1 local_90 [8];
  path keyFile;
  undefined1 local_68 [8];
  string subdir;
  allocator local_31;
  string local_30;
  ValidatorKeys_test *local_10;
  ValidatorKeys_test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Make Validator Keys",&local_31);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,&local_30,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,"test_key_file",
             (allocator *)(keyFile.m_pathname.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(keyFile.m_pathname.field_2._M_local_buf + 0xf));
  boost::filesystem::path::path(&local_b0,(string_type *)local_68);
  boost::filesystem::path::path((path *)&__range2,"validator_keys.json");
  boost::filesystem::operator/((path *)local_90,&local_b0,(path *)&__range2);
  boost::filesystem::path::~path((path *)&__range2);
  boost::filesystem::path::~path(&local_b0);
  __end2 = std::array<jbcoin::KeyType,_2UL>::begin(&this->keyTypes);
  pvVar1 = std::array<jbcoin::KeyType,_2UL>::end(&this->keyTypes);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    keys._92_4_ = *__end2;
    ValidatorKeys::ValidatorKeys((ValidatorKeys *)&g.test_,(KeyType *)&keys.revoked_);
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)local_178,&this->super_suite,(string *)local_68);
    ValidatorKeys::writeToFile((ValidatorKeys *)&g.test_,(path *)local_90);
    keys2._95_1_ = boost::filesystem::exists((path *)local_90);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&keys2.field_0x5f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4a);
    ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_1e0,(path *)local_90);
    g_1.test_._7_1_ =
         ValidatorKeys::operator==((ValidatorKeys *)&g.test_,(ValidatorKeys *)local_1e0);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)((long)&g_1.test_ + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4d);
    ValidatorKeys::~ValidatorKeys((ValidatorKeys *)local_1e0);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)local_178);
    ValidatorKeys::~ValidatorKeys((ValidatorKeys *)&g.test_);
  }
  KeyFileGuard::KeyFileGuard
            ((KeyFileGuard *)((long)&expectedError.field_2 + 8),&this->super_suite,
             (string *)local_68);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&error.field_2 + 8),"Failed to open key file: ",psVar2);
  std::__cxx11::string::string(local_250);
  ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)&e,(path *)local_90);
  ValidatorKeys::~ValidatorKeys((ValidatorKeys *)&e);
  local_2b9[0] = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(error.field_2._M_local_buf + 8));
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,local_2b9,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x5b);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_2e0,"Unable to parse json key file: ",psVar2);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::ofstream::ofstream(local_4e0,(string *)psVar2,_S_trunc);
  std::operator<<((ostream *)local_4e0,"{{}");
  std::ofstream::close();
  std::ofstream::~ofstream(local_4e0);
  ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)&e_1,(path *)local_90);
  ValidatorKeys::~ValidatorKeys((ValidatorKeys *)&e_1);
  jv._15_1_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_250,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (error.field_2._M_local_buf + 8));
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&jv.field_0xf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x6b);
  Json::Value::Value((Value *)local_560,nullValue);
  Json::Value::Value(&local_570,"field");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"dummy");
  Json::Value::operator=(pVVar3,&local_570);
  Json::Value::~Value(&local_570);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_5b0,"Key file \'",psVar2);
  std::operator+(&local_590,&local_5b0,"\' is missing \"key_type\" field");
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_5b0);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_5c0,"dummy keytype");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"key_type");
  Json::Value::operator=(pVVar3,&local_5c0);
  Json::Value::~Value(&local_5c0);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_600,"Key file \'",psVar2);
  std::operator+(&local_5e0,&local_600,"\' is missing \"secret_key\" field");
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_610,"dummy secret");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"secret_key");
  Json::Value::operator=(pVVar3,&local_610);
  Json::Value::~Value(&local_610);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_650,"Key file \'",psVar2);
  std::operator+(&local_630,&local_650,"\' is missing \"token_sequence\" field");
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_660,"dummy sequence");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"token_sequence");
  Json::Value::operator=(pVVar3,&local_660);
  Json::Value::~Value(&local_660);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_6a0,"Key file \'",psVar2);
  std::operator+(&local_680,&local_6a0,"\' is missing \"revoked\" field");
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_6a0);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_6b0,"dummy revoked");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"revoked");
  Json::Value::operator=(pVVar3,&local_6b0);
  Json::Value::~Value(&local_6b0);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_710,"Key file \'",psVar2);
  std::operator+(&local_6f0,&local_710,"\' contains invalid \"key_type\" field: ");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"key_type");
  Json::Value::toStyledString_abi_cxx11_((string *)local_730,pVVar3);
  std::operator+(&local_6d0,&local_6f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)local_730);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  local_734 = ed25519;
  value_00 = to_string(ed25519);
  Json::Value::Value(&local_748,value_00);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"key_type");
  Json::Value::operator=(pVVar3,&local_748);
  Json::Value::~Value(&local_748);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_7a8,"Key file \'",psVar2);
  std::operator+(&local_788,&local_7a8,"\' contains invalid \"secret_key\" field: ");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"secret_key");
  Json::Value::toStyledString_abi_cxx11_((string *)&keys_1.tokenSequence_,pVVar3);
  std::operator+(&local_768,&local_788,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &keys_1.tokenSequence_);
  psVar2 = (string *)(error.field_2._M_local_buf + 8);
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_768);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&keys_1.tokenSequence_);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7a8);
  testKeyFile(this,(path *)local_90,(Value *)local_560,psVar2);
  ValidatorKeys::ValidatorKeys((ValidatorKeys *)(kp.second.buf_ + 0x18),&local_734);
  randomSeed();
  generateKeyPair((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)local_878,ed25519,&local_888);
  Seed::~Seed(&local_888);
  toBase58_abi_cxx11_(&local_8b8,(jbcoin *)&DAT_00000020,(int)&kp + 0x28,(SecretKey *)psVar2);
  Json::Value::Value(&local_898,&local_8b8);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"secret_key");
  Json::Value::operator=(pVVar3,&local_898);
  Json::Value::~Value(&local_898);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::pair<jbcoin::PublicKey,_jbcoin::SecretKey>::~pair
            ((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)local_878);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_918,"Key file \'",psVar2);
  std::operator+(&local_8f8,&local_918,"\' contains invalid \"token_sequence\" field: ");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_938,pVVar3);
  std::operator+(&local_8d8,&local_8f8,&local_938);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_948,-1);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"token_sequence");
  Json::Value::operator=(pVVar3,&local_948);
  Json::Value::~Value(&local_948);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_9a8,"Key file \'",psVar2);
  std::operator+(&local_988,&local_9a8,"\' contains invalid \"token_sequence\" field: ");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_9c8,pVVar3);
  std::operator+(&local_968,&local_988,&local_9c8);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  value = std::numeric_limits<unsigned_int>::max();
  Json::Value::Value(&local_9d8,value);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"token_sequence");
  Json::Value::operator=(pVVar3,&local_9d8);
  Json::Value::~Value(&local_9d8);
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_90);
  std::operator+(&local_a38,"Key file \'",psVar2);
  std::operator+(&local_a18,&local_a38,"\' contains invalid \"revoked\" field: ");
  pVVar3 = Json::Value::operator[]((Value *)local_560,"revoked");
  Json::Value::toStyledString_abi_cxx11_(&local_a58,pVVar3);
  std::operator+(&local_9f8,&local_a18,&local_a58);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)(error.field_2._M_local_buf + 8));
  Json::Value::Value(&local_a68,false);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"revoked");
  Json::Value::operator=(pVVar3,&local_a68);
  Json::Value::~Value(&local_a68);
  std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),"");
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)((long)&error.field_2 + 8));
  Json::Value::Value(&local_a78,true);
  pVVar3 = Json::Value::operator[]((Value *)local_560,"revoked");
  Json::Value::operator=(pVVar3,&local_a78);
  Json::Value::~Value(&local_a78);
  testKeyFile(this,(path *)local_90,(Value *)local_560,(string *)((long)&error.field_2 + 8));
  ValidatorKeys::~ValidatorKeys((ValidatorKeys *)(kp.second.buf_ + 0x18));
  Json::Value::~Value((Value *)local_560);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
  KeyFileGuard::~KeyFileGuard((KeyFileGuard *)((long)&expectedError.field_2 + 8));
  boost::filesystem::path::~path((path *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void
    testMakeValidatorKeys ()
    {
        testcase ("Make Validator Keys");

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        path const keyFile = subdir / "validator_keys.json";

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys const keys (keyType);

            KeyFileGuard const g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT (exists (keyFile));

            auto const keys2 = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == keys2);
        }
        {
            // Require expected fields
            KeyFileGuard g (*this, subdir);

            auto expectedError =
                "Failed to open key file: " + keyFile.string();
            std::string error;
            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            expectedError =
                "Unable to parse json key file: " + keyFile.string();

            {
                std::ofstream o (keyFile.string (), std::ios_base::trunc);
                o << "{{}";
                o.close();
            }

            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            Json::Value jv;
            jv["dummy"] = "field";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"key_type\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["key_type"] = "dummy keytype";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"secret_key\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["secret_key"] = "dummy secret";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"token_sequence\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = "dummy sequence";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"revoked\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = "dummy revoked";
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"key_type\" field: " +
                jv["key_type"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            auto const keyType = KeyType::ed25519;
            jv["key_type"] = to_string(keyType);
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"secret_key\" field: " +
                jv["secret_key"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            ValidatorKeys const keys (keyType);
            {
                auto const kp = generateKeyPair (keyType, randomSeed ());
                jv["secret_key"] =
                    toBase58(TOKEN_NODE_PRIVATE, kp.second);
            }
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = -1;
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] =
                Json::UInt(std::numeric_limits<std::uint32_t>::max ());
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"revoked\" field: " +
                jv["revoked"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = false;
            expectedError = "";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = true;
            testKeyFile (keyFile, jv, expectedError);
        }
    }